

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_encoder.cc
# Opt level: O0

void __thiscall
draco::DirectBitEncoder::EndEncoding(DirectBitEncoder *this,EncoderBuffer *target_buffer)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  DirectBitEncoder *in_RDI;
  uint *unaff_retaddr;
  EncoderBuffer *in_stack_00000008;
  uint32_t size_in_byte;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  DirectBitEncoder *data_size;
  
  data_size = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (in_RSI,(value_type_conflict5 *)
                    CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->bits_);
  EncoderBuffer::Encode<unsigned_int>(in_stack_00000008,unaff_retaddr);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x251db7);
  EncoderBuffer::Encode(in_stack_00000008,unaff_retaddr,(size_t)data_size);
  Clear(in_RDI);
  return;
}

Assistant:

void DirectBitEncoder::EndEncoding(EncoderBuffer *target_buffer) {
  bits_.push_back(local_bits_);
  const uint32_t size_in_byte = static_cast<uint32_t>(bits_.size()) * 4;
  target_buffer->Encode(size_in_byte);
  target_buffer->Encode(bits_.data(), size_in_byte);
  Clear();
}